

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrument_pass.cpp
# Opt level: O0

unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_> __thiscall
spvtools::opt::InstrumentPass::StartFunction
          (InstrumentPass *this,uint32_t func_id,Type *return_type,
          vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
          *param_types)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  initializer_list<spvtools::opt::Operand> __l;
  IRContext *this_00;
  TypeManager *this_01;
  DefUseManager *this_02;
  type inst;
  undefined4 in_register_00000034;
  InstrumentPass *this_03;
  vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
  *in_R8;
  Operand *local_168;
  uint32_t local_160;
  Op local_15c;
  IRContext *local_158;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_150
  ;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> func_inst
  ;
  SmallVector<unsigned_int,_2UL> local_130;
  uint local_104;
  iterator local_100;
  undefined8 local_f8;
  SmallVector<unsigned_int,_2UL> local_f0;
  Operand local_c8;
  Operand OStack_98;
  iterator local_68;
  _func_int **local_60;
  undefined1 local_58 [8];
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> operands;
  Function *func_type;
  TypeManager *type_mgr;
  vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
  *param_types_local;
  Type *return_type_local;
  InstrumentPass *pIStack_18;
  uint32_t func_id_local;
  InstrumentPass *this_local;
  
  this_03 = (InstrumentPass *)CONCAT44(in_register_00000034,func_id);
  return_type_local._4_4_ = SUB84(return_type,0);
  pIStack_18 = this_03;
  this_local = this;
  this_00 = Pass::context((Pass *)this_03);
  this_01 = IRContext::get_type_mgr(this_00);
  operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)GetFunction(this_03,(Type *)param_types,in_R8);
  local_104 = 0;
  local_100 = &local_104;
  local_f8 = 1;
  init_list_00._M_len = 1;
  init_list_00._M_array = local_100;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_f0,init_list_00);
  Operand::Operand(&local_c8,SPV_OPERAND_TYPE_LITERAL_INTEGER,&local_f0);
  func_inst._M_t.
  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_ =
       analysis::TypeManager::GetId
                 (this_01,(Type *)operands.
                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  init_list._M_len = 1;
  init_list._M_array =
       (iterator)
       ((long)&func_inst._M_t.
               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl + 4);
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_130,init_list);
  Operand::Operand(&OStack_98,SPV_OPERAND_TYPE_ID,&local_130);
  local_68 = &local_c8;
  local_60 = (_func_int **)0x2;
  std::allocator<spvtools::opt::Operand>::allocator
            ((allocator<spvtools::opt::Operand> *)
             ((long)&func_inst._M_t.
                     super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                     .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl + 3));
  __l._M_len = (size_type)local_60;
  __l._M_array = local_68;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_58,__l
             ,(allocator_type *)
              ((long)&func_inst._M_t.
                      super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                      .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl + 3))
  ;
  std::allocator<spvtools::opt::Operand>::~allocator
            ((allocator<spvtools::opt::Operand> *)
             ((long)&func_inst._M_t.
                     super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                     .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl + 3));
  local_168 = (Operand *)&local_68;
  do {
    local_168 = local_168 + -1;
    Operand::~Operand(local_168);
  } while (local_168 != &local_c8);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_130);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_f0);
  local_158 = Pass::context((Pass *)this_03);
  local_15c = OpFunction;
  local_160 = analysis::TypeManager::GetId(this_01,(Type *)param_types);
  MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,unsigned_int,unsigned_int&,std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>const&>
            ((spvtools *)&local_150,&local_158,&local_15c,&local_160,
             (uint *)((long)&return_type_local + 4),
             (vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_58);
  this_02 = Pass::get_def_use_mgr((Pass *)this_03);
  inst = std::
         unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
         operator*(&local_150);
  analysis::DefUseManager::AnalyzeInstDefUse(this_02,inst);
  MakeUnique<spvtools::opt::Function,std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>>
            ((spvtools *)this,&local_150);
  std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
  ~unique_ptr(&local_150);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_58);
  return (__uniq_ptr_data<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>,_true,_true>
          )(__uniq_ptr_data<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<Function> InstrumentPass::StartFunction(
    uint32_t func_id, const analysis::Type* return_type,
    const std::vector<const analysis::Type*>& param_types) {
  analysis::TypeManager* type_mgr = context()->get_type_mgr();
  analysis::Function* func_type = GetFunction(return_type, param_types);

  const std::vector<Operand> operands{
      {spv_operand_type_t::SPV_OPERAND_TYPE_LITERAL_INTEGER,
       {uint32_t(spv::FunctionControlMask::MaskNone)}},
      {spv_operand_type_t::SPV_OPERAND_TYPE_ID, {type_mgr->GetId(func_type)}},
  };
  auto func_inst =
      MakeUnique<Instruction>(context(), spv::Op::OpFunction,
                              type_mgr->GetId(return_type), func_id, operands);
  get_def_use_mgr()->AnalyzeInstDefUse(&*func_inst);
  return MakeUnique<Function>(std::move(func_inst));
}